

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi)

{
  int num_workers_00;
  AV1_COMP *in_RDI;
  int num_workers;
  AV1CdefSync *cdef_sync;
  MultiThreadInfo *mt_info;
  int in_stack_000001a4;
  AV1_COMMON *in_stack_000001a8;
  MultiThreadInfo *in_stack_000001b0;
  int num_workers_01;
  MultiThreadInfo *mt_info_00;
  
  mt_info_00 = &in_RDI->mt_info;
  num_workers_01 = (int)((ulong)&(in_RDI->mt_info).cdef_sync >> 0x20);
  num_workers_00 = (in_RDI->mt_info).num_mod_workers[6];
  cdef_reset_job_info((AV1CdefSync *)0x260c7f);
  prepare_cdef_workers(in_RDI,cdef_filter_block_worker_hook,num_workers_00);
  launch_workers(mt_info_00,num_workers_01);
  sync_enc_workers(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
  return;
}

Assistant:

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
  const int num_workers = mt_info->num_mod_workers[MOD_CDEF_SEARCH];

  cdef_reset_job_info(cdef_sync);
  prepare_cdef_workers(cpi, cdef_filter_block_worker_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
}